

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnionFind.h
# Opt level: O1

int __thiscall covenant::UnionFind::lookup(UnionFind *this,int id)

{
  int id_00;
  int iVar1;
  
  id_00 = (this->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[id];
  iVar1 = id;
  if (id_00 != id) {
    iVar1 = lookup(this,id_00);
    (this->mapping).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[id] = iVar1;
  }
  return iVar1;
}

Assistant:

int lookup(int id){
      if(mapping[id] == id)
        return id;
      int ret = lookup(mapping[id]);
      mapping[id] = ret;
      return ret;
    }